

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.cc
# Opt level: O0

void __thiscall BitStream::reset(BitStream *this)

{
  uint uVar1;
  runtime_error *this_00;
  BitStream *this_local;
  
  this->p = this->start;
  this->bit_offset = 7;
  uVar1 = QIntC::to_uint<unsigned_long>(&this->nbytes);
  if (0x1fffffff < uVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"array too large for bitstream");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->bits_available = this->nbytes << 3;
  return;
}

Assistant:

void
BitStream::reset()
{
    p = start;
    bit_offset = 7;
    if (QIntC::to_uint(nbytes) > static_cast<unsigned int>(-1) / 8) {
        throw std::runtime_error("array too large for bitstream");
    }
    bits_available = 8 * nbytes;
}